

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modify_maximal_reconvergence.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ModifyMaximalReconvergence::AddMaximalReconvergence(ModifyMaximalReconvergence *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  IRContext *pIVar4;
  FeatureManager *this_00;
  Operand *this_01;
  Instruction *pIVar5;
  size_type sVar6;
  value_type *__x;
  value_type *__x_00;
  Operand *local_3c8;
  uint local_394;
  iterator local_390;
  undefined8 local_388;
  SmallVector<unsigned_int,_2UL> local_380;
  uint32_t local_354;
  iterator local_350;
  undefined8 local_348;
  SmallVector<unsigned_int,_2UL> local_340;
  Operand local_318;
  Operand OStack_2e8;
  undefined1 local_2b8 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_290
  ;
  allocator<char> local_281;
  string local_280;
  undefined1 local_25c [8];
  uint32_t id;
  Instruction entry_point;
  iterator __end2_2;
  iterator __begin2_2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_2;
  undefined1 local_1ac [12];
  Instruction mode;
  iterator __end2_1;
  iterator __begin2_1;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  entry_points_with_mode;
  string local_d0;
  undefined1 local_b0 [8];
  Instruction extension;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  bool has_shader;
  bool has_extension;
  bool changed;
  ModifyMaximalReconvergence *this_local;
  
  __range2._7_1_ = false;
  bVar1 = false;
  pIVar4 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_feature_mgr(pIVar4);
  __range2._5_1_ = FeatureManager::HasCapability(this_00,CapabilityShader);
  Pass::context(&this->super_Pass);
  IRContext::extensions((IRContext *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&extension.dbg_scope_);
  while (bVar2 = utils::operator!=(&__end2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)
                                   &extension.dbg_scope_), bVar2) {
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    opt::Instruction::Instruction((Instruction *)local_b0,pIVar5);
    this_01 = opt::Instruction::GetOperand((Instruction *)local_b0,0);
    Operand::AsString_abi_cxx11_(&local_d0,this_01);
    bVar2 = std::operator==(&local_d0,"SPV_KHR_maximal_reconvergence");
    std::__cxx11::string::~string((string *)&local_d0);
    if (bVar2) {
      bVar1 = true;
      entry_points_with_mode._M_h._M_single_bucket._4_4_ = 2;
    }
    else {
      entry_points_with_mode._M_h._M_single_bucket._4_4_ = 0;
    }
    opt::Instruction::~Instruction((Instruction *)local_b0);
    if (entry_points_with_mode._M_h._M_single_bucket._4_4_ != 0) break;
    InstructionList::iterator::operator++(&__end2);
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&__range2_1);
  Pass::get_module(&this->super_Pass);
  Module::execution_modes((Module *)&__begin2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_1);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&mode.dbg_scope_);
  while (bVar2 = utils::operator!=(&__end2_1.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)&mode.dbg_scope_
                                  ), bVar2) {
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2_1.super_iterator);
    opt::Instruction::Instruction((Instruction *)(local_1ac + 4),pIVar5);
    uVar3 = opt::Instruction::GetSingleWordInOperand((Instruction *)(local_1ac + 4),1);
    if (uVar3 == 0x1787) {
      local_1ac._0_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)(local_1ac + 4),0);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)&__range2_1,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_1ac,__x);
    }
    opt::Instruction::~Instruction((Instruction *)(local_1ac + 4));
    InstructionList::iterator::operator++(&__end2_1);
  }
  Pass::get_module(&this->super_Pass);
  Module::entry_points((Module *)&__begin2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2_2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&entry_point.dbg_scope_);
  while (bVar2 = utils::operator!=(&__end2_2.super_iterator,
                                   (iterator_template<spvtools::opt::Instruction> *)
                                   &entry_point.dbg_scope_), bVar2) {
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*(&__end2_2.super_iterator);
    opt::Instruction::Instruction((Instruction *)(local_25c + 4),pIVar5);
    local_25c._0_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)(local_25c + 4),1);
    sVar6 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range2_1,(key_type *)local_25c);
    if (sVar6 == 0) {
      __range2._7_1_ = true;
      if (!bVar1) {
        pIVar4 = Pass::context(&this->super_Pass);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_280,"SPV_KHR_maximal_reconvergence",&local_281);
        IRContext::AddExtension(pIVar4,&local_280);
        std::__cxx11::string::~string((string *)&local_280);
        std::allocator<char>::~allocator(&local_281);
        bVar1 = true;
      }
      if (__range2._5_1_ == false) {
        pIVar4 = Pass::context(&this->super_Pass);
        IRContext::AddCapability(pIVar4,CapabilityShader);
        __range2._5_1_ = true;
      }
      pIVar4 = Pass::context(&this->super_Pass);
      local_2b8._32_8_ = Pass::context(&this->super_Pass);
      local_2b8[0x1c] = '\x10';
      local_2b8[0x1d] = '\0';
      local_2b8[0x1e] = '\0';
      local_2b8[0x1f] = '\0';
      local_2b8[0x18] = '\0';
      local_2b8[0x19] = '\0';
      local_2b8[0x1a] = '\0';
      local_2b8[0x1b] = '\0';
      local_2b8._20_4_ = 0;
      local_354 = local_25c._0_4_;
      local_350 = &local_354;
      local_348 = 1;
      init_list_00._M_len = 1;
      init_list_00._M_array = local_350;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_340,init_list_00);
      Operand::Operand(&local_318,SPV_OPERAND_TYPE_ID,&local_340);
      local_394 = 0x1787;
      local_390 = &local_394;
      local_388 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_390;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_380,init_list);
      Operand::Operand(&OStack_2e8,SPV_OPERAND_TYPE_EXECUTION_MODE,&local_380);
      local_2b8._0_8_ = &local_318;
      local_2b8._8_8_ = (_func_int **)0x2;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
                ((spvtools *)&local_290,(IRContext **)(local_2b8 + 0x20),(Op *)(local_2b8 + 0x1c),
                 (int *)(local_2b8 + 0x18),(int *)(local_2b8 + 0x14),
                 (initializer_list<spvtools::opt::Operand> *)local_2b8);
      IRContext::AddExecutionMode(pIVar4,&local_290);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_290);
      local_3c8 = (Operand *)local_2b8;
      do {
        local_3c8 = local_3c8 + -1;
        Operand::~Operand(local_3c8);
      } while (local_3c8 != &local_318);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_380);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_340);
      std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)&__range2_1,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)local_25c,__x_00);
    }
    opt::Instruction::~Instruction((Instruction *)(local_25c + 4));
    InstructionList::iterator::operator++(&__end2_2);
  }
  entry_points_with_mode._M_h._M_single_bucket._4_4_ = 1;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)&__range2_1);
  return __range2._7_1_;
}

Assistant:

bool ModifyMaximalReconvergence::AddMaximalReconvergence() {
  bool changed = false;
  bool has_extension = false;
  bool has_shader =
      context()->get_feature_mgr()->HasCapability(spv::Capability::Shader);
  for (auto extension : context()->extensions()) {
    if (extension.GetOperand(0).AsString() == "SPV_KHR_maximal_reconvergence") {
      has_extension = true;
      break;
    }
  }

  std::unordered_set<uint32_t> entry_points_with_mode;
  for (auto mode : get_module()->execution_modes()) {
    if (spv::ExecutionMode(mode.GetSingleWordInOperand(1)) ==
        spv::ExecutionMode::MaximallyReconvergesKHR) {
      entry_points_with_mode.insert(mode.GetSingleWordInOperand(0));
    }
  }

  for (auto entry_point : get_module()->entry_points()) {
    const uint32_t id = entry_point.GetSingleWordInOperand(1);
    if (!entry_points_with_mode.count(id)) {
      changed = true;
      if (!has_extension) {
        context()->AddExtension("SPV_KHR_maximal_reconvergence");
        has_extension = true;
      }
      if (!has_shader) {
        context()->AddCapability(spv::Capability::Shader);
        has_shader = true;
      }
      context()->AddExecutionMode(MakeUnique<Instruction>(
          context(), spv::Op::OpExecutionMode, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {id}},
              {SPV_OPERAND_TYPE_EXECUTION_MODE,
               {static_cast<uint32_t>(
                   spv::ExecutionMode::MaximallyReconvergesKHR)}}}));
      entry_points_with_mode.insert(id);
    }
  }

  return changed;
}